

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
          (ExprComparator *this,
          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
          e)

{
  bool bVar1;
  int *piVar2;
  
  piVar2 = (int *)0x0;
  if (**(int **)(this + 8) - 0x35U < 6) {
    piVar2 = *(int **)(this + 8);
  }
  bVar1 = mp::Equal((Expr)((ExprBase *)(piVar2 + 2))->impl_,
                    (Expr)((ExprBase *)
                          ((long)e.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.
                                 super_ExprBase.impl_ + 8))->impl_);
  if (bVar1) {
    bVar1 = mp::Equal((Expr)((ExprBase *)(piVar2 + 4))->impl_,
                      (Expr)((ExprBase *)
                            ((long)e.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.
                                   super_ExprBase.impl_ + 0x10))->impl_);
    return bVar1;
  }
  return false;
}

Assistant:

bool VisitBinary(E e) {
    E binary = Cast<E>(expr_);
    return Equal(binary.lhs(), e.lhs()) && Equal(binary.rhs(), e.rhs());
  }